

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7Dec.c
# Opt level: O3

Bool_conflict Ppmd7z_RangeDec_Init(CPpmd7z_RangeDec *p)

{
  Byte BVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  
  p->Range = 0xffffffff;
  p->Code = 0;
  BVar1 = (*p->Stream->Read)(p->Stream);
  uVar3 = 0;
  if (BVar1 == '\0') {
    uVar3 = p->Code;
    iVar4 = 4;
    do {
      bVar2 = (*p->Stream->Read)(p->Stream);
      uVar3 = (uint)bVar2 | uVar3 << 8;
      p->Code = uVar3;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    uVar3 = (uint)(uVar3 != 0xffffffff);
  }
  return uVar3;
}

Assistant:

Bool Ppmd7z_RangeDec_Init(CPpmd7z_RangeDec *p)
{
  unsigned i;
  p->Code = 0;
  p->Range = 0xFFFFFFFF;
  if (p->Stream->Read((void *)p->Stream) != 0)
    return False;
  for (i = 0; i < 4; i++)
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
  return (p->Code < 0xFFFFFFFF);
}